

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonnetfmt.cpp
# Opt level: O3

void usage(ostream *o)

{
  version(o);
  std::__ostream_insert<char,std::char_traits<char>>(o,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"jsonnetfmt {<option>} { <filename> }\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>(o,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(o,"Available options:\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"  -h / --help             This message\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"  -e / --exec             Treat filename as code\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"  -o / --output-file <file> Write to the output file rather than stdout\n",0x48);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"  -i / --in-place         Update the Jsonnet file(s) in place.\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"  --test                  Exit with failure if reformatting changed the file(s).\n",
             0x51);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,
             "  -n / --indent <n>       Number of spaces to indent by (default 2, 0 means no change)\n"
             ,0x57);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"  --max-blank-lines <n>   Max vertical spacing, 0 means no change (default 2)\n",
             0x4e);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"  --string-style <d|s|l>  Enforce double, single (default) quotes or \'leave\'\n",
             0x4d);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,
             "  --comment-style <h|s|l> # (h), // (s)(default), or \'leave\'; never changes she-bang\n"
             ,0x55);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,
             "  --[no-]pretty-field-names Use syntax sugar for fields and indexing (on by default)\n"
             ,0x55);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"  --[no-]pad-arrays       [ 1, 2, 3 ] instead of [1, 2, 3]\n",0x3b);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"  --[no-]pad-objects      { x: 1, y: 2 } instead of {x: 1, y: 2} (on by default)\n",
             0x51);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"  --[no-]sort-imports     Sorting of imports (on by default)\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"  --debug-desugaring      Unparse the desugared AST without executing it\n",0x49);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"  --version               Print version\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>(o,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(o,"In all cases:\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(o,"<filename> can be - (stdin)\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"Multichar options are expanded e.g. -abc becomes -a -b -c.\n",0x3b);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"The -- option suppresses option processing for subsequent arguments.\n",0x45);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"Note that since filenames and jsonnet programs can begin with -, it is advised to\n"
             ,0x52);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"use -- if the argument is unknown, e.g. jsonnet -- \"$FILENAME\".",0x3f);
  std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + (char)o);
  std::ostream::put((char)o);
  std::ostream::flush();
  return;
}

Assistant:

void usage(std::ostream &o)
{
    version(o);
    o << "\n";
    o << "jsonnetfmt {<option>} { <filename> }\n";
    o << "\n";
    o << "Available options:\n";
    o << "  -h / --help             This message\n";
    o << "  -e / --exec             Treat filename as code\n";
    o << "  -o / --output-file <file> Write to the output file rather than stdout\n";
    o << "  -i / --in-place         Update the Jsonnet file(s) in place.\n";
    o << "  --test                  Exit with failure if reformatting changed the file(s).\n";
    o << "  -n / --indent <n>       Number of spaces to indent by (default 2, 0 means no change)\n";
    o << "  --max-blank-lines <n>   Max vertical spacing, 0 means no change (default 2)\n";
    o << "  --string-style <d|s|l>  Enforce double, single (default) quotes or 'leave'\n";
    o << "  --comment-style <h|s|l> # (h), // (s)(default), or 'leave'; never changes she-bang\n";
    o << "  --[no-]pretty-field-names Use syntax sugar for fields and indexing (on by default)\n";
    o << "  --[no-]pad-arrays       [ 1, 2, 3 ] instead of [1, 2, 3]\n";
    o << "  --[no-]pad-objects      { x: 1, y: 2 } instead of {x: 1, y: 2} (on by default)\n";
    o << "  --[no-]sort-imports     Sorting of imports (on by default)\n";
    o << "  --debug-desugaring      Unparse the desugared AST without executing it\n";
    o << "  --version               Print version\n";
    o << "\n";
    o << "In all cases:\n";
    o << "<filename> can be - (stdin)\n";
    o << "Multichar options are expanded e.g. -abc becomes -a -b -c.\n";
    o << "The -- option suppresses option processing for subsequent arguments.\n";
    o << "Note that since filenames and jsonnet programs can begin with -, it is advised to\n";
    o << "use -- if the argument is unknown, e.g. jsonnet -- \"$FILENAME\".";
    o << std::endl;
}